

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O0

matrix<trng::GF2,_4UL> * trng::power<trng::GF2,4ul>(matrix<trng::GF2,_4UL> *a,unsigned_long_long m)

{
  ulong in_RDX;
  matrix<trng::GF2,_4UL> *in_RDI;
  matrix_type powers;
  anon_class_1_0_00000001 unit;
  matrix_type *res;
  matrix<trng::GF2,_4UL> *this;
  ulong local_18;
  
  this = in_RDI;
  matrix<trng::GF2,4ul>::
  matrix<trng::power<trng::GF2,4ul>(trng::matrix<trng::GF2,4ul>const&,unsigned_long_long)::_lambda(unsigned_long,unsigned_long)_1_>
            ();
  matrix<trng::GF2,_4UL>::matrix(this,in_RDI);
  local_18 = in_RDX;
  while (local_18 != 0) {
    if ((local_18 & 1) == 1) {
      operator*(a,(matrix<trng::GF2,_4UL> *)m);
      matrix<trng::GF2,_4UL>::operator=(this,in_RDI);
      matrix<trng::GF2,_4UL>::~matrix((matrix<trng::GF2,_4UL> *)0x4060fa);
    }
    local_18 = local_18 >> 1;
    if (local_18 == 0) break;
    operator*(a,(matrix<trng::GF2,_4UL> *)m);
    matrix<trng::GF2,_4UL>::operator=(this,in_RDI);
    matrix<trng::GF2,_4UL>::~matrix((matrix<trng::GF2,_4UL> *)0x40616d);
  }
  matrix<trng::GF2,_4UL>::~matrix((matrix<trng::GF2,_4UL> *)0x406181);
  return this;
}

Assistant:

matrix<T, n> power(const matrix<T, n> &a, unsigned long long m) {
    using matrix_type = matrix<T, n>;
    using size_type = typename matrix_type::size_type;

    auto unit = [&](size_type i, size_type j) -> T { return i == j ? T{1} : T{0}; };
    matrix_type res(unit);
    matrix_type powers(a);
    while (m > 0) {
      if ((m & 1ull) == 1ull)
        res = res * powers;
      m >>= 1u;
      if (m == 0)
        break;
      powers = powers * powers;
    }
    return res;
  }